

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

ns_connection * ns_bind(ns_mgr *srv,char *str,ns_callback_t callback,void *user_data)

{
  sock_t sock_00;
  char local_128 [4];
  sock_t sock;
  char ca_cert [100];
  char local_b8 [8];
  char cert [100];
  int local_4c;
  int proto;
  int use_ssl;
  ns_connection *nc;
  socket_address sa;
  void *user_data_local;
  ns_callback_t callback_local;
  char *str_local;
  ns_mgr *srv_local;
  
  _proto = (ns_connection *)0x0;
  sa.sin.sin_zero = (uchar  [8])user_data;
  user_data_local = callback;
  callback_local = (ns_callback_t)str;
  str_local = (char *)srv;
  ns_parse_address(str,(socket_address *)&nc,(int *)(cert + 0x60),&local_4c,local_b8,local_128);
  if ((local_4c == 0) || (local_b8[0] != '\0')) {
    sock_00 = ns_open_listening_socket((socket_address *)&nc,cert._96_4_);
    if (sock_00 != -1) {
      _proto = ns_add_sock((ns_mgr *)str_local,sock_00,(ns_callback_t)user_data_local,(void *)0x0);
      if (_proto == (ns_connection *)0x0) {
        close(sock_00);
      }
      else {
        *(ns_connection **)&_proto->sa = nc;
        *(undefined8 *)((long)&_proto->sa + 8) = sa._0_8_;
        _proto->flags = _proto->flags | 0x80;
        _proto->user_data = (void *)sa.sin.sin_zero;
        _proto->callback = (ns_callback_t)user_data_local;
        if (cert._96_4_ == 2) {
          _proto->flags = _proto->flags | 0x100;
        }
      }
    }
    srv_local = (ns_mgr *)_proto;
  }
  else {
    srv_local = (ns_mgr *)0x0;
  }
  return (ns_connection *)srv_local;
}

Assistant:

struct ns_connection *ns_bind(struct ns_mgr *srv, const char *str,
                              ns_callback_t callback, void *user_data) {
  union socket_address sa;
  struct ns_connection *nc = NULL;
  int use_ssl, proto;
  char cert[100], ca_cert[100];
  sock_t sock;

  ns_parse_address(str, &sa, &proto, &use_ssl, cert, ca_cert);
  if (use_ssl && cert[0] == '\0') return NULL;

  if ((sock = ns_open_listening_socket(&sa, proto)) == INVALID_SOCKET) {
  } else if ((nc = ns_add_sock(srv, sock, callback, NULL)) == NULL) {
    closesocket(sock);
  } else {
    nc->sa = sa;
    nc->flags |= NSF_LISTENING;
    nc->user_data = user_data;
    nc->callback = callback;

    if (proto == SOCK_DGRAM) {
      nc->flags |= NSF_UDP;
    }

#ifdef NS_ENABLE_SSL
    if (use_ssl) {
      nc->ssl_ctx = SSL_CTX_new(SSLv23_server_method());
      if (ns_use_cert(nc->ssl_ctx, cert) != 0 ||
          ns_use_ca_cert(nc->ssl_ctx, ca_cert) != 0) {
        ns_close_conn(nc);
        nc = NULL;
      }
    }
#endif

    DBG(("%p sock %d/%d ssl %p %p", nc, sock, proto, nc->ssl_ctx, nc->ssl));
  }

  return nc;
}